

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_sparse_feedback_temporaries
          (CompilerGLSL *this,uint32_t result_type_id,uint32_t id,uint32_t *feedback_id,
          uint32_t *texel_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  SPIRType *pSVar4;
  runtime_error *prVar5;
  uint32_t local_54;
  string local_50;
  
  local_54 = id;
  if ((this->options).es == true) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Sparse texture feedback is not supported on ESSL.","");
    ::std::runtime_error::runtime_error(prVar5,(string *)&local_50);
    *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
    __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GL_ARB_sparse_texture2","")
  ;
  require_extension_internal(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pmVar3 = ::std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->extra_sub_expressions,&local_54);
  uVar2 = *pmVar3;
  if (uVar2 == 0) {
    uVar2 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,2);
    *pmVar3 = uVar2;
  }
  *feedback_id = uVar2;
  *texel_id = *pmVar3 + 1;
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type_id);
  if ((*(int *)&(pSVar4->super_IVariant).field_0xc == 0xf) &&
     ((pSVar4->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size == 2)) {
    emit_uninitialized_temporary
              (this,((pSVar4->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr)->id,
               *feedback_id);
    emit_uninitialized_temporary
              (this,(pSVar4->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[1].id,
               *texel_id);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Invalid return type for sparse feedback.","");
  ::std::runtime_error::runtime_error(prVar5,(string *)&local_50);
  *(undefined ***)prVar5 = &PTR__runtime_error_003d4e98;
  __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::emit_sparse_feedback_temporaries(uint32_t result_type_id, uint32_t id, uint32_t &feedback_id,
                                                    uint32_t &texel_id)
{
	// Need to allocate two temporaries.
	if (options.es)
		SPIRV_CROSS_THROW("Sparse texture feedback is not supported on ESSL.");
	require_extension_internal("GL_ARB_sparse_texture2");

	auto &temps = extra_sub_expressions[id];
	if (temps == 0)
		temps = ir.increase_bound_by(2);

	feedback_id = temps + 0;
	texel_id = temps + 1;

	auto &return_type = get<SPIRType>(result_type_id);
	if (return_type.basetype != SPIRType::Struct || return_type.member_types.size() != 2)
		SPIRV_CROSS_THROW("Invalid return type for sparse feedback.");
	emit_uninitialized_temporary(return_type.member_types[0], feedback_id);
	emit_uninitialized_temporary(return_type.member_types[1], texel_id);
}